

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CXMLReaderImpl.h
# Opt level: O0

bool __thiscall
irr::io::CXMLReaderImpl<unsigned_short,_irr::io::IXMLBase>::readFile
          (CXMLReaderImpl<unsigned_short,_irr::io::IXMLBase> *this,IFileReadCallBack *callback)

{
  uint uVar1;
  int sizeWithoutHeader;
  int iVar2;
  long *source;
  int UTF32_LE;
  int UTF32_BE;
  int UTF16_LE;
  int UTF16_BE;
  uchar UTF8 [3];
  char32 *data32;
  char16 *data16;
  char *data8;
  int size;
  IFileReadCallBack *callback_local;
  CXMLReaderImpl<unsigned_short,_irr::io::IXMLBase> *this_local;
  
  uVar1 = (*callback->_vptr_IFileReadCallBack[3])();
  sizeWithoutHeader = uVar1 + 4;
  source = (long *)operator_new__((long)sizeWithoutHeader);
  iVar2 = (*callback->_vptr_IFileReadCallBack[2])(callback,source,(ulong)uVar1);
  if (iVar2 == 0) {
    if (source != (long *)0x0) {
      operator_delete__(source);
    }
    this_local._7_1_ = false;
  }
  else {
    *(undefined1 *)((long)source + (long)(int)(uVar1 + 3)) = 0;
    *(undefined1 *)((long)source + (long)(int)(uVar1 + 2)) = 0;
    *(undefined1 *)((long)source + (long)(int)(uVar1 + 1)) = 0;
    *(undefined1 *)((long)source + (long)(int)uVar1) = 0;
    if ((sizeWithoutHeader < 4) || (*source != -0x20000)) {
      if ((sizeWithoutHeader < 4) || (*source != 0xfeff)) {
        if ((sizeWithoutHeader < 2) || ((short)*source != -2)) {
          if ((sizeWithoutHeader < 2) || ((short)*source != -0x101)) {
            if ((((sizeWithoutHeader < 3) || ((char)*source != 0xef)) ||
                (*(char *)((long)source + 1) != 0xbb)) || (*(char *)((long)source + 2) != 0xbf)) {
              this->SourceFormat = ETF_ASCII;
              convertTextData<char>(this,(char *)source,(char *)source,sizeWithoutHeader);
            }
            else {
              this->SourceFormat = ETF_UTF8;
              convertTextData<char>
                        (this,(char *)((long)source + 3),(char *)source,sizeWithoutHeader);
            }
          }
          else {
            this->SourceFormat = ETF_UTF16_LE;
            convertTextData<unsigned_short>
                      (this,(unsigned_short *)((long)source + 2),(char *)source,
                       sizeWithoutHeader / 2);
          }
        }
        else {
          this->SourceFormat = ETF_UTF16_BE;
          convertTextData<unsigned_short>
                    (this,(unsigned_short *)((long)source + 2),(char *)source,sizeWithoutHeader / 2)
          ;
        }
      }
      else {
        this->SourceFormat = ETF_UTF32_LE;
        convertTextData<unsigned_long>
                  (this,(unsigned_long *)(source + 1),(char *)source,sizeWithoutHeader / 4);
      }
    }
    else {
      this->SourceFormat = ETF_UTF32_BE;
      convertTextData<unsigned_long>
                (this,(unsigned_long *)(source + 1),(char *)source,sizeWithoutHeader / 4);
    }
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool readFile(IFileReadCallBack* callback)
	{
		int size = callback->getSize();		
		size += 4; // We need two terminating 0's at the end.
		           // For ASCII we need 1 0's, for UTF-16 2, for UTF-32 4.

		char* data8 = new char[size];

		if (!callback->read(data8, size-4))
		{
			delete [] data8;
			return false;
		}

		// add zeros at end

		data8[size-1] = 0;
		data8[size-2] = 0;
		data8[size-3] = 0;
		data8[size-4] = 0;

		char16* data16 = reinterpret_cast<char16*>(data8);
		char32* data32 = reinterpret_cast<char32*>(data8);	

		// now we need to convert the data to the desired target format
		// based on the byte order mark.

		const unsigned char UTF8[] = {0xEF, 0xBB, 0xBF}; // 0xEFBBBF;
		const int UTF16_BE = 0xFFFE;
		const int UTF16_LE = 0xFEFF;
		const int UTF32_BE = 0xFFFE0000;
		const int UTF32_LE = 0x0000FEFF;

		// check source for all utf versions and convert to target data format
		
		if (size >= 4 && data32[0] == (char32)UTF32_BE)
		{
			// UTF-32, big endian
			SourceFormat = ETF_UTF32_BE;
			convertTextData(data32+1, data8, (size/4)); // data32+1 because we need to skip the header
		}
		else
		if (size >= 4 && data32[0] == (char32)UTF32_LE)
		{
			// UTF-32, little endian
			SourceFormat = ETF_UTF32_LE;
			convertTextData(data32+1, data8, (size/4)); // data32+1 because we need to skip the header
		}
		else
		if (size >= 2 && data16[0] == UTF16_BE)
		{
			// UTF-16, big endian
			SourceFormat = ETF_UTF16_BE;
			convertTextData(data16+1, data8, (size/2)); // data16+1 because we need to skip the header
		}
		else
		if (size >= 2 && data16[0] == UTF16_LE)
		{
			// UTF-16, little endian
			SourceFormat = ETF_UTF16_LE;
			convertTextData(data16+1, data8, (size/2)); // data16+1 because we need to skip the header
		}
		else
		if (size >= 3 && data8[0] == UTF8[0] && data8[1] == UTF8[1] && data8[2] == UTF8[2])
		{
			// UTF-8
			SourceFormat = ETF_UTF8;
			convertTextData(data8+3, data8, size); // data8+3 because we need to skip the header
		}
		else
		{
			// ASCII
			SourceFormat = ETF_ASCII;
			convertTextData(data8, data8, size);
		}

		return true;
	}